

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O0

bool OverlapBoundedPlaneXYZHelper(double *a_bounded_plane,ON_RTreeBBox *a_rect)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double v;
  double d;
  double z;
  double y;
  double x;
  uchar flag;
  ON_RTreeBBox *a_rect_local;
  double *a_bounded_plane_local;
  
  dVar1 = a_bounded_plane[1] * a_rect->m_min[1];
  dVar2 = a_bounded_plane[2] * a_rect->m_min[2];
  dVar4 = a_bounded_plane[3];
  dVar3 = *a_bounded_plane * a_rect->m_min[0] + dVar1 + dVar2 + dVar4;
  if (a_bounded_plane[4] <= dVar3) {
    if (dVar3 < a_bounded_plane[5] || dVar3 == a_bounded_plane[5]) {
      return true;
    }
    x._7_1_ = 2;
  }
  else {
    x._7_1_ = 1;
  }
  dVar3 = *a_bounded_plane * a_rect->m_max[0];
  dVar1 = dVar3 + dVar1 + dVar2 + dVar4;
  if (a_bounded_plane[4] <= dVar1) {
    if (dVar1 < a_bounded_plane[5] || dVar1 == a_bounded_plane[5]) {
      return true;
    }
    x._7_1_ = x._7_1_ | 2;
    if (x._7_1_ == 3) {
      return true;
    }
  }
  else {
    x._7_1_ = x._7_1_ | 1;
    if (x._7_1_ == 3) {
      return true;
    }
  }
  dVar1 = a_bounded_plane[1] * a_rect->m_max[1];
  dVar2 = dVar3 + dVar1 + dVar2 + dVar4;
  if (a_bounded_plane[4] <= dVar2) {
    if (dVar2 < a_bounded_plane[5] || dVar2 == a_bounded_plane[5]) {
      return true;
    }
    x._7_1_ = x._7_1_ | 2;
    if (x._7_1_ == 3) {
      return true;
    }
  }
  else {
    x._7_1_ = x._7_1_ | 1;
    if (x._7_1_ == 3) {
      return true;
    }
  }
  dVar2 = a_bounded_plane[2] * a_rect->m_max[2];
  dVar3 = dVar3 + dVar1 + dVar2 + dVar4;
  if (a_bounded_plane[4] <= dVar3) {
    if (dVar3 < a_bounded_plane[5] || dVar3 == a_bounded_plane[5]) {
      return true;
    }
    x._7_1_ = x._7_1_ | 2;
    if (x._7_1_ == 3) {
      return true;
    }
  }
  else {
    x._7_1_ = x._7_1_ | 1;
    if (x._7_1_ == 3) {
      return true;
    }
  }
  dVar3 = *a_bounded_plane * a_rect->m_min[0];
  dVar1 = dVar3 + dVar1 + dVar2 + dVar4;
  if (a_bounded_plane[4] <= dVar1) {
    if (dVar1 < a_bounded_plane[5] || dVar1 == a_bounded_plane[5]) {
      return true;
    }
    x._7_1_ = x._7_1_ | 2;
    if (x._7_1_ == 3) {
      return true;
    }
  }
  else {
    x._7_1_ = x._7_1_ | 1;
    if (x._7_1_ == 3) {
      return true;
    }
  }
  dVar1 = a_bounded_plane[1] * a_rect->m_min[1];
  dVar3 = dVar3 + dVar1 + dVar2 + dVar4;
  if (a_bounded_plane[4] <= dVar3) {
    if (dVar3 < a_bounded_plane[5] || dVar3 == a_bounded_plane[5]) {
      return true;
    }
    x._7_1_ = x._7_1_ | 2;
    if (x._7_1_ == 3) {
      return true;
    }
  }
  else {
    x._7_1_ = x._7_1_ | 1;
    if (x._7_1_ == 3) {
      return true;
    }
  }
  dVar1 = *a_bounded_plane * a_rect->m_max[0] + dVar1 + dVar2 + dVar4;
  if (a_bounded_plane[4] <= dVar1) {
    if (dVar1 < a_bounded_plane[5] || dVar1 == a_bounded_plane[5]) {
      return true;
    }
    x._7_1_ = x._7_1_ | 2;
    if (x._7_1_ == 3) {
      return true;
    }
  }
  else {
    x._7_1_ = x._7_1_ | 1;
    if (x._7_1_ == 3) {
      return true;
    }
  }
  dVar4 = *a_bounded_plane * a_rect->m_min[0] + a_bounded_plane[1] * a_rect->m_max[1] +
          a_bounded_plane[2] * a_rect->m_min[2] + dVar4;
  if (a_bounded_plane[4] <= dVar4) {
    if (dVar4 < a_bounded_plane[5] || dVar4 == a_bounded_plane[5]) {
      return true;
    }
    if ((x._7_1_ | 2) == 3) {
      return true;
    }
  }
  else if ((x._7_1_ | 1) == 3) {
    return true;
  }
  return false;
}

Assistant:

static
bool OverlapBoundedPlaneXYZHelper( const double* a_bounded_plane, const ON_RTreeBBox* a_rect )
{
  unsigned char flag = 0;
  double x, y, z, d, v;
  
  // check the 8 corners of the box minimizing the number of evaluations
  // and unrolling the loop for speed

  // corner = (min, min, min)
  x = a_bounded_plane[0]*a_rect->m_min[0]; 
  y = a_bounded_plane[1]*a_rect->m_min[1];
  z = a_bounded_plane[2]*a_rect->m_min[2];
  d = a_bounded_plane[3];
  v = x + y + z + d;
  if ( v < a_bounded_plane[4] )
    flag = 1;
  else if ( v > a_bounded_plane[5] )
    flag = 2;
  else
    return true;
  
  // corner = (max, min, min)
  x = a_bounded_plane[0]*a_rect->m_max[0]; 
  v = x + y + z + d;
  if ( v < a_bounded_plane[4] )
  {
    flag |= 1;
    if ( 3 == flag )
      return true;
  }
  else if ( v > a_bounded_plane[5] )
  {
    flag |= 2;
    if ( 3 == flag )
      return true;
  }
  else
    return true;
  
  // corner = (max, max, min)
  y = a_bounded_plane[1]*a_rect->m_max[1];
  v = x + y + z + d;
  if ( v < a_bounded_plane[4] )
  {
    flag |= 1;
    if ( 3 == flag )
      return true;
  }
  else if ( v > a_bounded_plane[5] )
  {
    flag |= 2;
    if ( 3 == flag )
      return true;
  }
  else
    return true;
    
  // corner = (max, max, max)
  z = a_bounded_plane[2]*a_rect->m_max[2];
  v = x + y + z + d;
  if ( v < a_bounded_plane[4] )
  {
    flag |= 1;
    if ( 3 == flag )
      return true;
  }
  else if ( v > a_bounded_plane[5] )
  {
    flag |= 2;
    if ( 3 == flag )
      return true;
  }
  else
    return true;

  // corner = (min, max, max)
  x = a_bounded_plane[0]*a_rect->m_min[0]; 
  v = x + y + z + d;
  if ( v < a_bounded_plane[4] )
  {
    flag |= 1;
    if ( 3 == flag )
      return true;
  }
  else if ( v > a_bounded_plane[5] )
  {
    flag |= 2;
    if ( 3 == flag )
      return true;
  }
  else
    return true;
  
  // corner = (min, min, max)
  y = a_bounded_plane[1]*a_rect->m_min[1];
  v = x + y + z + d;
  if ( v < a_bounded_plane[4] )
  {
    flag |= 1;
    if ( 3 == flag )
      return true;
  }
  else if ( v > a_bounded_plane[5] )
  {
    flag |= 2;
    if ( 3 == flag )
      return true;
  }
  else
    return true;

  // corner = (max, min, max)
  x = a_bounded_plane[0]*a_rect->m_max[0]; 
  v = x + y + z + d;
  if ( v < a_bounded_plane[4] )
  {
    flag |= 1;
    if ( 3 == flag )
      return true;
  }
  else if ( v > a_bounded_plane[5] )
  {
    flag |= 2;
    if ( 3 == flag )
      return true;
  }
  else
    return true;

  // corner = (min, max, min)
  x = a_bounded_plane[0]*a_rect->m_min[0]; 
  y = a_bounded_plane[1]*a_rect->m_max[1];
  z = a_bounded_plane[2]*a_rect->m_min[2];
  v = x + y + z + d;
  if ( v < a_bounded_plane[4] )
  {
    flag |= 1;
    if ( 3 == flag )
      return true;
  }
  else if ( v > a_bounded_plane[5] )
  {
    flag |= 2;
    if ( 3 == flag )
      return true;
  }
  else
    return true;
  
  // Either all 8 box corners 
  // are below the min plane (flag=1)
  // or above the max plane (flag=2).
  return false;
}